

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_process_agents(REF_INTERP ref_interp)

{
  uint uVar1;
  long lVar2;
  REF_INT local_d8;
  int local_d4;
  int local_c4;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT sweep;
  REF_INT n_agents;
  REF_INT node;
  REF_INT id;
  REF_INT i;
  REF_AGENTS ref_agents;
  REF_MPI ref_mpi;
  REF_CELL from_cell;
  REF_NODE to_node;
  REF_NODE from_node;
  REF_INTERP ref_interp_local;
  
  to_node = ref_interp->from_grid->node;
  from_cell = (REF_CELL)ref_interp->to_grid->node;
  ref_agents = (REF_AGENTS)ref_interp->ref_mpi;
  _id = ref_interp->ref_agents;
  ref_private_macro_code_rss_1 = 0;
  if (ref_interp->from_grid->twod == 0) {
    ref_mpi = (REF_MPI)ref_interp->from_tet;
  }
  else {
    ref_mpi = (REF_MPI)ref_interp->from_tri;
  }
  ref_private_macro_code_rss = _id->n;
  from_node = (REF_NODE)ref_interp;
  uVar1 = ref_mpi_allsum((REF_MPI)ref_agents,&ref_private_macro_code_rss,1,1);
  if (uVar1 == 0) {
    do {
      if (ref_private_macro_code_rss < 1) {
        uVar1 = ref_mpi_allsum((REF_MPI)ref_agents,&from_node->naux,1,1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x3b6,"ref_interp_process_agents",(ulong)uVar1,"sum");
          return uVar1;
        }
        uVar1 = ref_mpi_allsum((REF_MPI)ref_agents,&from_node->real,1,1);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_allsum((REF_MPI)ref_agents,(void *)((long)&from_node->real + 4),1,1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3b9,"ref_interp_process_agents",(ulong)uVar1,"sum");
            return uVar1;
          }
          sweep = 0;
          while( true ) {
            if (from_cell->last_node_is_an_id <= sweep) {
              return 0;
            }
            if ((((-1 < sweep) && (sweep < from_cell->last_node_is_an_id)) &&
                (-1 < *(long *)(*(long *)&from_cell->edge_per + (long)sweep * 8))) &&
               ((*(int *)(*(long *)&from_cell[1].size_per + 4) ==
                 *(int *)(*(long *)&from_cell->n + (long)sweep * 4) &&
                (lVar2 = (long)*(int *)(*(long *)&from_node->n_unused + (long)sweep * 4), lVar2 != 0
                )))) break;
            sweep = sweep + 1;
          }
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x3bd,"ref_interp_process_agents","should be done",0,lVar2);
          return 1;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3b7,"ref_interp_process_agents",(ulong)uVar1,"sum");
        return uVar1;
      }
      if ((*(int *)&from_node->age != 0) && (*(int *)(*(long *)from_node + 4) == 0)) {
        printf(" %2d sweep",(ulong)(uint)ref_private_macro_code_rss_1);
      }
      if (*(int *)&from_node->age != 0) {
        ref_agents_population(_id,"agent pop");
      }
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
      for (n_agents = 0; n_agents < _id->max; n_agents = n_agents + 1) {
        if ((((_id->agent[n_agents].mode != REF_AGENT_UNUSED) &&
             (_id->agent[n_agents].mode == REF_AGENT_WALKING)) &&
            (_id->agent[n_agents].part == ref_agents->max)) &&
           (uVar1 = ref_interp_walk_agent((REF_INTERP)from_node,n_agents), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x367,"ref_interp_process_agents",(ulong)uVar1,"walking");
          return uVar1;
        }
      }
      uVar1 = ref_agents_migrate(_id);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x36b,"ref_interp_process_agents",(ulong)uVar1,"send it");
        return uVar1;
      }
      for (n_agents = 0; n_agents < _id->max; n_agents = n_agents + 1) {
        if (((_id->agent[n_agents].mode != REF_AGENT_UNUSED) &&
            (_id->agent[n_agents].mode == REF_AGENT_HOP_PART)) &&
           (_id->agent[n_agents].part == ref_agents->max)) {
          uVar1 = ref_node_local(to_node,_id->agent[n_agents].global,&sweep);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x371,"ref_interp_process_agents",(ulong)uVar1,"localize");
            return uVar1;
          }
          _id->agent[n_agents].mode = REF_AGENT_WALKING;
          if ((sweep < 0) || (**(int **)&ref_mpi[1].max_tag <= sweep)) {
            local_c4 = -1;
          }
          else {
            local_c4 = *(int *)(*(long *)(*(long *)&ref_mpi[1].max_tag + 8) + (long)sweep * 4);
          }
          if (local_c4 == -1) {
            local_d8 = -1;
          }
          else {
            if ((sweep < 0) || (**(int **)&ref_mpi[1].max_tag <= sweep)) {
              local_d4 = -1;
            }
            else {
              local_d4 = *(int *)(*(long *)(*(long *)&ref_mpi[1].max_tag + 8) + (long)sweep * 4);
            }
            local_d8 = *(REF_INT *)
                        (*(long *)(*(long *)&ref_mpi[1].max_tag + 0x10) + 4 + (long)local_d4 * 8);
          }
          _id->agent[n_agents].seed = local_d8;
        }
      }
      for (n_agents = 0; n_agents < _id->max; n_agents = n_agents + 1) {
        if (((_id->agent[n_agents].mode != REF_AGENT_UNUSED) &&
            (_id->agent[n_agents].mode == REF_AGENT_SUGGESTION)) &&
           (_id->agent[n_agents].home == ref_agents->max)) {
          uVar1 = ref_node_local((REF_NODE)from_cell,_id->agent[n_agents].global,&sweep);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x37c,"ref_interp_process_agents",(ulong)uVar1,"localize");
            return uVar1;
          }
          if ((*(int *)((long)from_node->unused_global + (long)sweep * 4) == -1) &&
             (*(int *)(*(long *)&from_node->n_unused + (long)sweep * 4) == 0)) {
            *(undefined4 *)
             (*(long *)((long)from_node->same_normal_tol + 0x10) + (long)n_agents * 0x68) = 1;
            *(REF_INT *)
             (*(long *)((long)from_node->same_normal_tol + 0x10) + (long)n_agents * 0x68 + 0x10) =
                 sweep;
            *(undefined8 *)
             (*(long *)((long)from_node->same_normal_tol + 0x10) + (long)n_agents * 0x68 + 0x20) =
                 0xffffffffffffffff;
            *(undefined4 *)(*(long *)&from_node->n_unused + (long)sweep * 4) = 1;
          }
          else {
            uVar1 = ref_agents_remove((REF_AGENTS)from_node->same_normal_tol,n_agents);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x37f,"ref_interp_process_agents",(ulong)uVar1,"already got one");
              return uVar1;
            }
          }
        }
      }
      for (n_agents = 0; n_agents < _id->max; n_agents = n_agents + 1) {
        if (((_id->agent[n_agents].mode != REF_AGENT_UNUSED) &&
            ((_id->agent[n_agents].mode == REF_AGENT_AT_BOUNDARY ||
             (_id->agent[n_agents].mode == REF_AGENT_TERMINATED)))) &&
           (_id->agent[n_agents].home == ref_agents->max)) {
          sweep = _id->agent[n_agents].node;
          if (((sweep < 0) || (from_cell->last_node_is_an_id <= sweep)) ||
             (*(long *)(*(long *)&from_cell->edge_per + (long)sweep * 8) < 0)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x38e,"ref_interp_process_agents","not valid");
            return 1;
          }
          if (*(int *)(*(long *)&from_cell[1].size_per + 4) !=
              *(int *)(*(long *)&from_cell->n + (long)sweep * 4)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x38f,"ref_interp_process_agents","ghost, not owned");
            return 1;
          }
          lVar2 = (long)*(int *)((long)from_node->unused_global + (long)sweep * 4);
          if (lVar2 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x390,"ref_interp_process_agents","already found?",0xffffffffffffffff,lVar2);
            return 1;
          }
          if (*(int *)(*(long *)&from_node->n_unused + (long)sweep * 4) == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x391,"ref_interp_process_agents","should have an agent");
            return 1;
          }
          if (_id->agent[n_agents].mode == REF_AGENT_TERMINATED) {
            from_node->naux = _id->agent[n_agents].step + 1 + from_node->naux;
            *(int *)((long)&from_node->real + 4) = *(int *)((long)&from_node->real + 4) + 1;
          }
          *(undefined4 *)(*(long *)&from_node->n_unused + (long)sweep * 4) = 0;
          uVar1 = ref_agents_remove(_id,n_agents);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x397,"ref_interp_process_agents",(ulong)uVar1,"no longer needed");
            return uVar1;
          }
        }
      }
      for (n_agents = 0; n_agents < _id->max; n_agents = n_agents + 1) {
        if (((_id->agent[n_agents].mode != REF_AGENT_UNUSED) &&
            (_id->agent[n_agents].mode == REF_AGENT_ENCLOSING)) &&
           (_id->agent[n_agents].home == ref_agents->max)) {
          sweep = _id->agent[n_agents].node;
          if (((sweep < 0) || (from_cell->last_node_is_an_id <= sweep)) ||
             (*(long *)(*(long *)&from_cell->edge_per + (long)sweep * 8) < 0)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x39f,"ref_interp_process_agents","not valid");
            return 1;
          }
          if (*(int *)(*(long *)&from_cell[1].size_per + 4) !=
              *(int *)(*(long *)&from_cell->n + (long)sweep * 4)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3a0,"ref_interp_process_agents","ghost, not owned");
            return 1;
          }
          lVar2 = (long)*(int *)((long)from_node->unused_global + (long)sweep * 4);
          if (lVar2 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3a1,"ref_interp_process_agents","already found?",0xffffffffffffffff,lVar2);
            return 1;
          }
          if (*(int *)(*(long *)&from_node->n_unused + (long)sweep * 4) == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3a2,"ref_interp_process_agents","should have an agent");
            return 1;
          }
          *(REF_INT *)((long)from_node->unused_global + (long)sweep * 4) = _id->agent[n_agents].seed
          ;
          *(REF_INT *)(from_node->old_n_global + (long)sweep * 4) = _id->agent[n_agents].part;
          for (node = 0; node < 4; node = node + 1) {
            *(REF_DBL *)(from_node->new_n_global + (long)(node + sweep * 4) * 8) =
                 _id->agent[n_agents].bary[node];
          }
          from_node->naux = _id->agent[n_agents].step + 1 + from_node->naux;
          *(int *)&from_node->real = *(int *)&from_node->real + 1;
          *(undefined4 *)(*(long *)&from_node->n_unused + (long)sweep * 4) = 0;
          uVar1 = ref_agents_remove(_id,n_agents);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3ac,"ref_interp_process_agents",(ulong)uVar1,"no longer needed");
            return uVar1;
          }
          uVar1 = ref_interp_push_onto_queue((REF_INTERP)from_node,sweep);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3ad,"ref_interp_process_agents",(ulong)uVar1,"push");
            return uVar1;
          }
        }
      }
      ref_private_macro_code_rss = _id->n;
      ref_interp_local._4_4_ = ref_mpi_allsum((REF_MPI)ref_agents,&ref_private_macro_code_rss,1,1);
    } while (ref_interp_local._4_4_ == 0);
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x3b2,
           "ref_interp_process_agents",(ulong)ref_interp_local._4_4_,"sum");
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x35c,
           "ref_interp_process_agents",(ulong)uVar1,"sum");
    ref_interp_local._4_4_ = uVar1;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_process_agents(REF_INTERP ref_interp) {
  REF_NODE from_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_NODE to_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  REF_CELL from_cell;
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT i, id, node;
  REF_INT n_agents;
  REF_INT sweep = 0;

  if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_agents = ref_agents_n(ref_agents);
  RSS(ref_mpi_allsum(ref_mpi, &n_agents, 1, REF_INT_TYPE), "sum");

  while (n_agents > 0) {
    if (ref_interp->instrument && ref_mpi_once(ref_interp->ref_mpi))
      printf(" %2d sweep", sweep);
    if (ref_interp->instrument) ref_agents_population(ref_agents, "agent pop");
    sweep++;

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_WALKING == ref_agent_mode(ref_agents, id) &&
          ref_agent_part(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_interp_walk_agent(ref_interp, id), "walking");
      }
    }

    RSS(ref_agents_migrate(ref_agents), "send it");

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_HOP_PART == ref_agent_mode(ref_agents, id) &&
          ref_agent_part(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_node_local(from_node, ref_agent_global(ref_agents, id), &node),
            "localize");
        ref_agent_mode(ref_agents, id) = REF_AGENT_WALKING;
        /* pick best from orbit? */
        ref_agent_seed(ref_agents, id) = ref_cell_first_with(from_cell, node);
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_SUGGESTION == ref_agent_mode(ref_agents, id) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_node_local(to_node, ref_agent_global(ref_agents, id), &node),
            "localize");
        if (REF_EMPTY != ref_interp->cell[node] ||
            ref_interp->agent_hired[node]) {
          RSS(ref_agents_remove(ref_interp->ref_agents, id), "already got one");
        } else {
          ref_agent_mode(ref_interp->ref_agents, id) = REF_AGENT_WALKING;
          ref_agent_node(ref_interp->ref_agents, id) = node;
          ref_agent_global(ref_interp->ref_agents, id) = REF_EMPTY;
          ref_interp->agent_hired[node] = REF_TRUE;
        }
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if ((REF_AGENT_AT_BOUNDARY == ref_agent_mode(ref_agents, id) ||
           REF_AGENT_TERMINATED == ref_agent_mode(ref_agents, id)) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        node = ref_agent_node(ref_agents, id);
        RAS(ref_node_valid(to_node, node), "not valid");
        RAS(ref_node_owned(to_node, node), "ghost, not owned");
        REIS(REF_EMPTY, ref_interp->cell[node], "already found?");
        RAS(ref_interp->agent_hired[node], "should have an agent");
        if (REF_AGENT_TERMINATED == ref_agent_mode(ref_agents, id)) {
          (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
          (ref_interp->n_terminated)++;
        }
        ref_interp->agent_hired[node] = REF_FALSE; /* but no more */
        RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        node = ref_agent_node(ref_agents, id);
        RAS(ref_node_valid(to_node, node), "not valid");
        RAS(ref_node_owned(to_node, node), "ghost, not owned");
        REIS(REF_EMPTY, ref_interp->cell[node], "already found?");
        RAS(ref_interp->agent_hired[node], "should have an agent");

        ref_interp->cell[node] = ref_agent_seed(ref_agents, id);
        ref_interp->part[node] = ref_agent_part(ref_agents, id);
        for (i = 0; i < 4; i++)
          ref_interp->bary[i + 4 * node] = ref_agent_bary(ref_agents, i, id);
        (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
        (ref_interp->n_walk)++;

        ref_interp->agent_hired[node] = REF_FALSE; /* but no more */
        RSS(ref_agents_remove(ref_agents, id), "no longer needed");
        RSS(ref_interp_push_onto_queue(ref_interp, node), "push");
      }
    }

    n_agents = ref_agents_n(ref_agents);
    RSS(ref_mpi_allsum(ref_mpi, &n_agents, 1, REF_INT_TYPE), "sum");
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->walk_steps), 1, REF_INT_TYPE),
      "sum");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_walk), 1, REF_INT_TYPE), "sum");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_terminated), 1, REF_INT_TYPE),
      "sum");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node))
      REIS(REF_FALSE, ref_interp->agent_hired[node], "should be done");
  }

  return REF_SUCCESS;
}